

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O1

uint64_t vfio_map_dma(void *vaddr,uint32_t size)

{
  int iVar1;
  ulong extraout_RDX;
  undefined8 uVar2;
  vfio_iommu_type1_dma_map dma_map;
  char buf [512];
  undefined8 uStack_258;
  undefined8 uStack_250;
  ulong uStack_248;
  code *pcStack_240;
  undefined8 local_238;
  void *local_230;
  void *local_228;
  ulong local_220;
  
  local_238 = 0x300000020;
  local_220 = (ulong)size;
  if ((long)(ulong)size < MIN_DMA_MEMORY) {
    local_220 = MIN_DMA_MEMORY;
  }
  pcStack_240 = (code *)0x107856;
  local_230 = vaddr;
  local_228 = vaddr;
  iVar1 = get_vfio_container();
  uVar2 = 0x3b71;
  pcStack_240 = (code *)0x107867;
  iVar1 = ioctl(iVar1,0x3b71,&local_238);
  if (iVar1 != -1) {
    return (uint64_t)vaddr;
  }
  pcStack_240 = vfio_unmap_dma;
  vfio_map_dma_cold_1();
  uStack_258 = 0x300000018;
  uStack_248 = extraout_RDX & 0xffffffff;
  uStack_250 = uVar2;
  pcStack_240 = (code *)vaddr;
  iVar1 = get_vfio_container();
  iVar1 = ioctl(iVar1,0x3b72,&uStack_258);
  return (long)iVar1;
}

Assistant:

uint64_t vfio_map_dma(void* vaddr, uint32_t size) {
	uint64_t iova = (uint64_t) vaddr; // map iova to process virtual address
	struct vfio_iommu_type1_dma_map dma_map = {
		.vaddr = (uint64_t) vaddr,
		.iova = iova,
		.size = size < MIN_DMA_MEMORY ? MIN_DMA_MEMORY : size,
		.argsz = sizeof(dma_map),
		.flags = VFIO_DMA_MAP_FLAG_READ | VFIO_DMA_MAP_FLAG_WRITE};
	int cfd = get_vfio_container();
	check_err(ioctl(cfd, VFIO_IOMMU_MAP_DMA, &dma_map), "IOMMU Map DMA Memory");
	return iova;
}